

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_stmt * sqlite3_next_stmt(sqlite3 *pDb,sqlite3_stmt *pStmt)

{
  long in_RSI;
  long in_RDI;
  sqlite3_stmt *pNext;
  undefined8 local_18;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x141d5e);
  if (in_RSI == 0) {
    local_18 = *(sqlite3_stmt **)(in_RDI + 8);
  }
  else {
    local_18 = *(sqlite3_stmt **)(in_RSI + 0x10);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x141d90);
  return local_18;
}

Assistant:

SQLITE_API sqlite3_stmt *sqlite3_next_stmt(sqlite3 *pDb, sqlite3_stmt *pStmt){
  sqlite3_stmt *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(pDb) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(pDb->mutex);
  if( pStmt==0 ){
    pNext = (sqlite3_stmt*)pDb->pVdbe;
  }else{
    pNext = (sqlite3_stmt*)((Vdbe*)pStmt)->pVNext;
  }
  sqlite3_mutex_leave(pDb->mutex);
  return pNext;
}